

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

Node * wasm::DataFlow::Node::makeCond(Node *block,Index index,Node *node)

{
  Node *this;
  
  this = (Node *)operator_new(0x30);
  this->type = Cond;
  this->origin = (Expression *)0x0;
  (this->values).super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values).super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values).super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  addValue(this,block);
  (this->field_1).index = index;
  addValue(this,node);
  return this;
}

Assistant:

static Node* makeCond(Node* block, Index index, Node* node) {
    Node* ret = new Node(Cond);
    ret->addValue(block);
    ret->index = index;
    ret->addValue(node);
    return ret;
  }